

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_lite_unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestEnumMapPlusExtraLite::Clear(TestEnumMapPlusExtraLite *this)

{
  google::protobuf::Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::clear
            ((Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *)&(this->field_0)._impl_);
  google::protobuf::Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite>::clear
            ((Map<int,_proto2_unittest::Proto2MapEnumPlusExtraLite> *)
             &(this->field_0)._impl_.unknown_map_field_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestEnumMapPlusExtraLite::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestEnumMapPlusExtraLite)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.known_map_field_.Clear();
  _impl_.unknown_map_field_.Clear();
  _internal_metadata_.Clear<std::string>();
}